

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O1

void __thiscall FMB::FiniteModelMultiSorted::initTables(FiniteModelMultiSorted *this)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  OperatorType *pOVar5;
  TermList TVar6;
  long lVar7;
  InvalidOperationException *this_00;
  uint i_1;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  
  ::Lib::DArray<unsigned_int>::ensure
            (&this->_f_offsets,
             (ulong)(*(long *)(DAT_00b7e1b0 + 0x68) - *(long *)(DAT_00b7e1b0 + 0x60)) >> 3 &
             0xffffffff);
  ::Lib::DArray<unsigned_int>::ensure
            (&this->_p_offsets,
             (ulong)(*(long *)(DAT_00b7e1b0 + 0x88) - *(long *)(DAT_00b7e1b0 + 0x80)) >> 3 &
             0xffffffff);
  lVar7 = *(long *)(DAT_00b7e1b0 + 0x60);
  uVar13 = 0;
  if ((*(long *)(DAT_00b7e1b0 + 0x68) - lVar7 & 0x7fffffff8U) != 0) {
    uVar8 = 0;
    do {
      uVar1 = *(uint *)(*(long *)(lVar7 + (long)(int)uVar8 * 8) + 0x20);
      uVar11 = (uint)uVar13;
      (this->_f_offsets)._array[uVar8] = uVar11;
      pOVar5 = Kernel::Signature::Symbol::fnType(*(Symbol **)(lVar7 + (ulong)uVar8 * 8));
      if (uVar1 == 0) {
        uVar9 = 1;
      }
      else {
        uVar9 = 1;
        uVar10 = 0;
        do {
          if (uVar10 < pOVar5->_typeArgsArity) {
            TVar6 = Kernel::AtomicSort::superSort();
          }
          else {
            TVar6._content =
                 *(uint64_t *)(pOVar5->_key + (ulong)(uVar10 - pOVar5->_typeArgsArity) * 8 + 8);
          }
          uVar9 = uVar9 * (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
      if (~uVar9 <= uVar11) {
        this_00 = (InvalidOperationException *)__cxa_allocate_exception(0x28);
        ::Lib::InvalidOperationException::InvalidOperationException
                  (this_00,"Model too large to represent!");
        goto LAB_002a4dbb;
      }
      uVar13 = (ulong)(uVar11 + uVar9);
      uVar8 = uVar8 + 1;
      lVar7 = *(long *)(DAT_00b7e1b0 + 0x60);
    } while (uVar8 < (uint)((ulong)(*(long *)(DAT_00b7e1b0 + 0x68) - lVar7) >> 3));
    uVar13 = (ulong)(uVar11 + uVar9);
  }
  uVar12 = (this->_f_interpretation)._size;
  ::Lib::DArray<unsigned_int>::expand(&this->_f_interpretation,uVar13);
  if (uVar12 <= uVar13 && uVar13 - uVar12 != 0) {
    memset((this->_f_interpretation)._array + uVar12,0,(uVar13 - uVar12) * 4);
  }
  lVar7 = *(long *)(DAT_00b7e1b0 + 0x80);
  uVar13 = 0;
  if ((*(long *)(DAT_00b7e1b0 + 0x88) - lVar7 & 0x7fffffff0U) != 0) {
    uVar8 = 1;
    do {
      uVar1 = *(uint *)(*(long *)(lVar7 + (long)(int)uVar8 * 8) + 0x20);
      uVar9 = (uint)uVar13;
      (this->_p_offsets)._array[uVar8] = uVar9;
      pOVar5 = Kernel::Signature::Symbol::predType(*(Symbol **)(lVar7 + (ulong)uVar8 * 8));
      uVar11 = 1;
      if (uVar1 != 0) {
        uVar10 = 0;
        do {
          if (uVar10 < pOVar5->_typeArgsArity) {
            TVar6 = Kernel::AtomicSort::superSort();
          }
          else {
            TVar6._content =
                 *(uint64_t *)(pOVar5->_key + (ulong)(uVar10 - pOVar5->_typeArgsArity) * 8 + 8);
          }
          uVar4 = (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
          if ((int)uVar4 < 2) {
            uVar4 = 1;
          }
          uVar11 = uVar11 * uVar4;
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
      if (~uVar11 <= uVar9) {
        this_00 = (InvalidOperationException *)__cxa_allocate_exception(0x28);
        ::Lib::InvalidOperationException::InvalidOperationException
                  (this_00,"Model too large to represent!");
LAB_002a4dbb:
        __cxa_throw(this_00,&::Lib::InvalidOperationException::typeinfo,::Lib::Exception::~Exception
                   );
      }
      uVar13 = (ulong)(uVar9 + uVar11);
      uVar8 = uVar8 + 1;
      lVar7 = *(long *)(DAT_00b7e1b0 + 0x80);
    } while (uVar8 < (uint)((ulong)(*(long *)(DAT_00b7e1b0 + 0x88) - lVar7) >> 3));
    uVar13 = (ulong)(uVar9 + uVar11);
  }
  uVar12 = (this->_p_interpretation)._size;
  ::Lib::DArray<char>::expand(&this->_p_interpretation,uVar13);
  if (uVar12 < uVar13) {
    do {
      (this->_p_interpretation)._array[uVar12] = '\0';
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  ::Lib::DArray<Lib::DArray<int>_>::ensure
            (&this->sortRepr,
             (ulong)(*(long *)(DAT_00b7e1b0 + 0xa8) - *(long *)(DAT_00b7e1b0 + 0xa0)) >> 3 &
             0xffffffff);
  if ((*(long *)(DAT_00b7e1b0 + 0xa8) - *(long *)(DAT_00b7e1b0 + 0xa0) & 0x7fffffff8U) != 0) {
    uVar13 = 0;
    do {
      if (3 < (int)uVar13 - 1U) {
        ::Lib::DArray<int>::ensure
                  ((this->sortRepr)._array + uVar13,(ulong)((this->_sizes)._array[uVar13] + 1));
        puVar2 = (this->_sizes)._array;
        piVar3 = (this->sortRepr)._array[uVar13]._array;
        uVar8 = 0;
        do {
          piVar3[uVar8] = -1;
          uVar8 = uVar8 + 1;
        } while (uVar8 <= puVar2[uVar13]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < ((ulong)(*(long *)(DAT_00b7e1b0 + 0xa8) - *(long *)(DAT_00b7e1b0 + 0xa0)) >> 3
                      & 0xffffffff));
  }
  return;
}

Assistant:

void FiniteModelMultiSorted::initTables()
{
  _f_offsets.ensure(env.signature->functions());
  _p_offsets.ensure(env.signature->predicates());

  // generate offsets per function for indexing f_interpreation
  // see addFunctionDefinition for how the offset is used to compute
  // the actual index
  unsigned offsets=0;
  for(unsigned f=0; f<env.signature->functions();f++){
    unsigned arity=env.signature->functionArity(f);
    _f_offsets[f]=offsets;

    OperatorType* sig = env.signature->getFunction(f)->fnType();
    unsigned add = 1;
    for(unsigned i=0;i<arity;i++) {
      add *= _sizes[sig->arg(i).term()->functor()];
    }

    if (UINT_MAX - add <= offsets) {
      // the SAT solver skipped some functions as they are eliminated
      // (the model, on the other hand, should be prepared to hold their values later too)
      INVALID_OPERATION("Model too large to represent!");
    }

    offsets += add;
  }
  _f_interpretation.expand(offsets,0);
  // can restart for predicates as indexing p_interepration instead
  offsets=0;
  for(unsigned p=1; p<env.signature->predicates();p++){
    unsigned arity=env.signature->predicateArity(p);
    _p_offsets[p]=offsets;

    OperatorType* sig = env.signature->getPredicate(p)->predType();
    unsigned add = 1;
    for(unsigned i=0;i<arity;i++) {
      int mult = _sizes[sig->arg(i).term()->functor()];
      ASS(mult>0);
      add *= (mult>0 ? mult : 1);
    }

    if (UINT_MAX - add <= offsets) {
      // the SAT solver skipped some functions as they are eliminated
      // (the model, on the other hand, should be prepared to hold their values later too)
      INVALID_OPERATION("Model too large to represent!");
    }

    offsets += add;
  }
  _p_interpretation.expand(offsets,0);

  sortRepr.ensure(env.signature->typeCons());
  for(unsigned s=0;s<env.signature->typeCons();s++){
    if(env.signature->isInterpretedNonDefault(s))
      continue;
    sortRepr[s].ensure(_sizes[s]+1);
    for(unsigned i=0;i<=_sizes[s];i++){
      sortRepr[s][i] = -1;
    }
  }
}